

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O2

void __thiscall
pstore::exchange::import_ns::callbacks::callbacks
          (callbacks *this,shared_ptr<pstore::exchange::import_ns::context> *ctxt,
          unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
          *root)

{
  std::__shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2> *)this,
             &ctxt->
              super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>);
  std::
  deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
  ::
  emplace_back<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
            ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
              *)&((this->context_).
                  super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->stack,root);
  return;
}

Assistant:

callbacks (std::shared_ptr<context> const & ctxt, std::unique_ptr<rule> && root)
                        : context_{ctxt} {
                    context_->stack.push (std::move (root));
                }